

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void av1_alloc_tile_data(AV1_COMP *cpi)

{
  AV1_COMP *cpi_00;
  int *align;
  void *pvVar1;
  long lVar2;
  long in_RDI;
  TileDataEnc *this_tile;
  int tile_index;
  int tile_col;
  int tile_row;
  int tile_rows;
  int tile_cols;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  int iVar3;
  int iVar4;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x3bf80);
  align = (int *)(in_RDI + 0x9ae98);
  iVar4 = *(int *)(in_RDI + 0x42020);
  iVar3 = *(int *)(in_RDI + 0x42024);
  av1_row_mt_mem_dealloc(cpi_00);
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *(undefined4 *)(in_RDI + 0x71320) = 0;
  align[1] = 0;
  *align = 0;
  pvVar1 = aom_memalign((size_t)align,CONCAT44(iVar4,iVar3));
  *(void **)(in_RDI + 0x71318) = pvVar1;
  if (*(long *)(in_RDI + 0x71318) == 0) {
    aom_internal_error(*(aom_internal_error_info **)
                        (cpi_00->enc_quant_dequant_params).quants.y_quant[2],AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->tile_data");
  }
  *(int *)(in_RDI + 0x71320) = iVar4 * iVar3;
  align[1] = iVar4;
  *align = iVar3;
  for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < iVar4; local_28 = local_28 + 1) {
      lVar2 = *(long *)(in_RDI + 0x71318) + (long)(local_24 * iVar4 + local_28) * 0x5d10;
      memset((void *)(lVar2 + 0x5cd8),0,0x30);
      *(undefined8 *)(lVar2 + 0x5320) = 0;
    }
  }
  return;
}

Assistant:

void av1_alloc_tile_data(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;

  av1_row_mt_mem_dealloc(cpi);

  aom_free(cpi->tile_data);
  cpi->allocated_tiles = 0;
  enc_row_mt->allocated_tile_cols = 0;
  enc_row_mt->allocated_tile_rows = 0;

  CHECK_MEM_ERROR(
      cm, cpi->tile_data,
      aom_memalign(32, tile_cols * tile_rows * sizeof(*cpi->tile_data)));

  cpi->allocated_tiles = tile_cols * tile_rows;
  enc_row_mt->allocated_tile_cols = tile_cols;
  enc_row_mt->allocated_tile_rows = tile_rows;
  for (int tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (int tile_col = 0; tile_col < tile_cols; ++tile_col) {
      const int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      av1_zero(this_tile->row_mt_sync);
      this_tile->row_ctx = NULL;
    }
  }
}